

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

void __thiscall
pbrt::SurfaceInteraction::SurfaceInteraction(SurfaceInteraction *this,SurfaceInteraction *param_2)

{
  uintptr_t uVar1;
  undefined8 uVar2;
  Interval<float> IVar3;
  Interval<float> IVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Float FVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  Float FVar30;
  
  (this->super_Interaction).mediumInterface = (param_2->super_Interaction).mediumInterface;
  IVar3 = (param_2->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  IVar4 = (param_2->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  FVar10 = (param_2->super_Interaction).time;
  fVar11 = (param_2->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar12 = (param_2->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar13 = (param_2->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar14 = (param_2->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  fVar15 = (param_2->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  uVar2 = *(undefined8 *)&(param_2->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar5 = *(undefined8 *)&(param_2->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>.y;
  (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
       (param_2->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IVar3;
  (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar4;
  (this->super_Interaction).time = FVar10;
  (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x = fVar11;
  (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y = fVar12;
  (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z = fVar13;
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = fVar14;
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar15;
  *(undefined8 *)&(this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z = uVar2;
  *(undefined8 *)&(this->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>.y = uVar5;
  (this->super_Interaction).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_Interaction).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (param_2->super_Interaction).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  fVar11 = (param_2->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar2 = *(undefined8 *)&(param_2->dpdu).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar12 = (param_2->dpdv).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar13 = (param_2->dpdv).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar14 = (param_2->dndu).super_Tuple3<pbrt::Normal3,_float>.x;
  fVar15 = (param_2->dndu).super_Tuple3<pbrt::Normal3,_float>.y;
  uVar5 = *(undefined8 *)&(param_2->dndu).super_Tuple3<pbrt::Normal3,_float>.z;
  fVar16 = (param_2->dndv).super_Tuple3<pbrt::Normal3,_float>.y;
  fVar17 = (param_2->dndv).super_Tuple3<pbrt::Normal3,_float>.z;
  fVar18 = (param_2->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  fVar19 = (param_2->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  uVar6 = *(undefined8 *)&(param_2->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar20 = (param_2->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  fVar21 = (param_2->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  uVar7 = *(undefined8 *)&(param_2->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar22 = (param_2->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar23 = (param_2->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar24 = (param_2->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar25 = (param_2->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar8 = *(undefined8 *)&(param_2->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar26 = (param_2->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
  fVar27 = (param_2->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar28 = (param_2->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
  fVar29 = (param_2->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
  uVar9 = *(undefined8 *)&(param_2->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
  (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.x =
       (param_2->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.y = fVar11;
  *(undefined8 *)&(this->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = uVar2;
  (this->dpdv).super_Tuple3<pbrt::Vector3,_float>.y = fVar12;
  (this->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = fVar13;
  (this->dndu).super_Tuple3<pbrt::Normal3,_float>.x = fVar14;
  (this->dndu).super_Tuple3<pbrt::Normal3,_float>.y = fVar15;
  *(undefined8 *)&(this->dndu).super_Tuple3<pbrt::Normal3,_float>.z = uVar5;
  (this->dndv).super_Tuple3<pbrt::Normal3,_float>.y = fVar16;
  (this->dndv).super_Tuple3<pbrt::Normal3,_float>.z = fVar17;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = fVar18;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar19;
  *(undefined8 *)&(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = uVar6;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = fVar20;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar21;
  *(undefined8 *)&(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = uVar7;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = fVar22;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = fVar23;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = fVar24;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = fVar25;
  *(undefined8 *)&(this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = uVar8;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = fVar26;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z = fVar27;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x = fVar28;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y = fVar29;
  *(undefined8 *)&(this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = uVar9;
  (this->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = 0;
  (this->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  uVar1 = (param_2->areaLight).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  (this->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = (param_2->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  (this->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = uVar1;
  fVar11 = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar2 = *(undefined8 *)&(param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar12 = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar13 = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  FVar10 = param_2->dudx;
  FVar30 = param_2->dvdx;
  (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x =
       (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = fVar11;
  *(undefined8 *)&(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = uVar2;
  (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = fVar12;
  (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = fVar13;
  this->dudx = FVar10;
  this->dvdx = FVar30;
  FVar10 = param_2->dvdy;
  this->dudy = param_2->dudy;
  this->dvdy = FVar10;
  return;
}

Assistant:

Interaction() = default;